

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O0

int __thiscall ncnn::Flatten::forward(Flatten *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uchar *__src;
  uchar *puVar5;
  Mat *in_RDX;
  long in_RSI;
  uchar *outptr;
  uchar *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  Mat *in_stack_ffffffffffffff40;
  Mat *this_00;
  Allocator *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  Mat *in_stack_ffffffffffffff68;
  int local_48;
  int local_4;
  
  iVar1 = *(int *)(in_RSI + 0x38);
  lVar2 = *(long *)(in_RSI + 0x10);
  iVar4 = *(int *)(in_RSI + 0x2c) * *(int *)(in_RSI + 0x30) * *(int *)(in_RSI + 0x34);
  ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  bVar3 = ncnn::Mat::empty(in_stack_ffffffffffffff40);
  if (bVar3) {
    local_4 = -100;
  }
  else {
    for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
      this_00 = (Mat *)&stack0xffffffffffffff68;
      ncnn::Mat::channel(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      __src = ncnn::Mat::operator_cast_to_unsigned_char_(this_00);
      ncnn::Mat::~Mat((Mat *)0x389a9c);
      puVar5 = ncnn::Mat::operator_cast_to_unsigned_char_(in_RDX);
      memcpy(puVar5 + iVar4 * lVar2 * (long)local_48,__src,iVar4 * lVar2);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Flatten::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h * d;

    top_blob.create(size * channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const unsigned char* ptr = bottom_blob.channel(q);
        unsigned char* outptr = (unsigned char*)top_blob + size * elemsize * q;

        memcpy(outptr, ptr, size * elemsize);
    }

    return 0;
}